

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptpubkey_get_type(uchar *bytes,size_t bytes_len,size_t *written)

{
  _Bool _Var1;
  size_t *written_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((bytes == (uchar *)0x0) || (bytes_len == 0)) || (written == (size_t *)0x0)) {
    bytes_local._4_4_ = -2;
  }
  else {
    _Var1 = scriptpubkey_is_op_return(bytes,bytes_len);
    if (_Var1) {
      *written = 1;
      bytes_local._4_4_ = 0;
    }
    else {
      _Var1 = scriptpubkey_is_multisig(bytes,bytes_len);
      if (_Var1) {
        *written = 0x20;
        bytes_local._4_4_ = 0;
      }
      else {
        switch(bytes_len) {
        case 0x16:
          _Var1 = scriptpubkey_is_p2wpkh(bytes,bytes_len);
          if (_Var1) {
            *written = 8;
            return 0;
          }
          break;
        case 0x17:
          _Var1 = scriptpubkey_is_p2sh(bytes,bytes_len);
          if (_Var1) {
            *written = 4;
            return 0;
          }
          break;
        case 0x19:
          _Var1 = scriptpubkey_is_p2pkh(bytes,bytes_len);
          if (_Var1) {
            *written = 2;
            return 0;
          }
          break;
        case 0x22:
          _Var1 = scriptpubkey_is_p2wsh(bytes,bytes_len);
          if (_Var1) {
            *written = 0x10;
            return 0;
          }
        }
        bytes_local._4_4_ = 0;
      }
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_scriptpubkey_get_type(const unsigned char *bytes, size_t bytes_len,
                                size_t *written)
{
    if (written)
        *written = WALLY_SCRIPT_TYPE_UNKNOWN;

    if (!bytes || !bytes_len || !written)
        return WALLY_EINVAL;

    if (scriptpubkey_is_op_return(bytes, bytes_len)) {
        *written = WALLY_SCRIPT_TYPE_OP_RETURN;
        return WALLY_OK;
    }

    if (scriptpubkey_is_multisig(bytes, bytes_len)) {
        *written = WALLY_SCRIPT_TYPE_MULTISIG;
        return WALLY_OK;
    }

    switch (bytes_len) {
    case WALLY_SCRIPTPUBKEY_P2PKH_LEN:
        if (scriptpubkey_is_p2pkh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2PKH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2SH_LEN:
        if (scriptpubkey_is_p2sh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2SH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2WPKH_LEN:
        if (scriptpubkey_is_p2wpkh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2WPKH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2WSH_LEN:
        if (scriptpubkey_is_p2wsh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2WSH;
            return WALLY_OK;
        }
        break;
    }
    return WALLY_OK;
}